

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseAssertScriptModuleCommand<wabt::AssertModuleCommand<(wabt::CommandType)3>>
          (WastParser *this,TokenType token_type,CommandPtr *out_command)

{
  Command *pCVar1;
  Result RVar2;
  Command *pCVar3;
  Enum EVar4;
  
  RVar2 = Expect(this,Lpar);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    RVar2 = Expect(this,token_type);
    if (RVar2.enum_ != Error) {
      pCVar3 = (Command *)operator_new(0x38);
      pCVar3->_vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar3->type = 0;
      pCVar3[1]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar3[1].type = 0;
      pCVar3[2]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar3[2].type = 0;
      pCVar3[3]._vptr_Command = (_func_int **)0x0;
      pCVar3->type = AssertMalformed;
      pCVar3->_vptr_Command = (_func_int **)&PTR__AssertModuleCommand_0155dd18;
      pCVar3[1]._vptr_Command = (_func_int **)0x0;
      *(CommandType **)&pCVar3[1].type = &pCVar3[2].type;
      pCVar3[2]._vptr_Command = (_func_int **)0x0;
      *(undefined1 *)&pCVar3[2].type = First;
      RVar2 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                      *)(pCVar3 + 1));
      EVar4 = Error;
      if (RVar2.enum_ != Error) {
        RVar2 = ParseQuotedText(this,(string *)&pCVar3[1].type);
        if (RVar2.enum_ != Error) {
          RVar2 = Expect(this,Rpar);
          if (RVar2.enum_ != Error) {
            pCVar1 = (out_command->_M_t).
                     super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                     super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                     super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
            (out_command->_M_t).
            super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
            super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
            super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar3;
            if (pCVar1 != (Command *)0x0) {
              (*pCVar1->_vptr_Command[1])();
            }
            EVar4 = Ok;
            pCVar3 = (Command *)0x0;
          }
        }
      }
      if (pCVar3 != (Command *)0x0) {
        (*pCVar3->_vptr_Command[1])(pCVar3);
      }
    }
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseAssertScriptModuleCommand(TokenType token_type,
                                                  CommandPtr* out_command) {
  WABT_TRACE(ParseAssertScriptModuleCommand);
  EXPECT(Lpar);
  CHECK_RESULT(Expect(token_type));
  auto command = MakeUnique<T>();
  CHECK_RESULT(ParseScriptModule(&command->module));
  CHECK_RESULT(ParseQuotedText(&command->text));
  EXPECT(Rpar);
  *out_command = std::move(command);
  return Result::Ok;
}